

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O3

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::choose_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *this,indexable_type *entry)

{
  pointer prVar1;
  stored_size_type sVar2;
  pointer prVar3;
  aabb_type *paVar4;
  double dVar5;
  size_t sVar6;
  ulong uVar7;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *in_R8;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  node_type n;
  double local_c0;
  node_type local_98;
  
  uVar8 = this->root_;
  if (uVar8 == 0xffffffffffffffff) {
    local_98.is_leaf = true;
    local_98.parent = 0xffffffffffffffff;
    local_98.entry.
    super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    .m_holder.m_size = 0;
    local_98.box.center.values_.elems[0] = (entry->center).values_.elems[0];
    local_98.box.center.values_.elems[1] = (entry->center).values_.elems[1];
    local_98.box.radius.values_.elems[0] = (entry->radius).values_.elems[0];
    local_98.box.radius.values_.elems[1] = (entry->radius).values_.elems[1];
    sVar6 = add_node(this,&local_98);
    this->root_ = sVar6;
    return sVar6;
  }
  uVar7 = (this->tree_).m_holder.m_size;
  if (uVar8 < uVar7) {
    do {
      prVar1 = (this->tree_).m_holder.m_start;
      if (prVar1[uVar8].is_leaf != false) {
        return uVar8;
      }
      sVar2 = prVar1[uVar8].entry.
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              .m_holder.m_size;
      uVar9 = uVar8;
      if (sVar2 != 0) {
        lVar10 = 0;
        dVar11 = 1.79769313486232e+308;
        local_c0 = 1.79769313486232e+308;
        do {
          uVar7 = *(ulong *)((long)prVar1[uVar8].box.center.values_.elems + lVar10 + -0x38);
          if ((this->tree_).m_holder.m_size <= uVar7) goto LAB_00108605;
          prVar3 = (this->tree_).m_holder.m_start;
          paVar4 = &prVar3[uVar7].box;
          dVar13 = (paVar4->radius).values_.elems[0];
          dVar12 = (paVar4->radius).values_.elems[1];
          dVar13 = (dVar12 + dVar12) * (dVar13 + dVar13);
          if (dVar13 < 0.0) {
LAB_0010865d:
            __assert_fail("retval >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/area.hpp"
                          ,0x15,
                          "typename boost::enable_if<traits::is_point<pointT>, typename traits::scalar_type_of<pointT>::type>::type perior::area(const rectangle<pointT> &, const boundaryT<pointT> &) [pointT = perior::point<double, 2>, boundaryT = perior::cubic_periodic_boundary]"
                         );
          }
          expand<perior::point<double,2ul>>
                    ((type *)&local_98,(perior *)&prVar3[uVar7].box,entry,
                     (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
          dVar12 = ((double)local_98.entry.
                            super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                            .m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                            storage._8_8_ +
                   (double)local_98.entry.
                           super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                           .m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                           storage._8_8_) *
                   ((double)local_98.entry.
                            super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                            .m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                            storage._0_8_ +
                   (double)local_98.entry.
                           super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                           .m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.
                           storage._0_8_);
          if (dVar12 < 0.0) goto LAB_0010865d;
          dVar13 = dVar12 - dVar13;
          dVar5 = local_c0;
          if (dVar13 < dVar11) {
LAB_001085d0:
            uVar9 = *(ulong *)((long)prVar1[uVar8].box.center.values_.elems + lVar10 + -0x38);
            dVar11 = dVar13;
            dVar5 = dVar12;
            if (local_c0 <= dVar12) {
              dVar5 = local_c0;
            }
          }
          else if (((dVar13 == dVar11) && (!NAN(dVar13) && !NAN(dVar11))) && (dVar12 < local_c0))
          goto LAB_001085d0;
          local_c0 = dVar5;
          lVar10 = lVar10 + 8;
        } while (sVar2 << 3 != lVar10);
        uVar7 = (this->tree_).m_holder.m_size;
      }
      uVar8 = uVar9;
    } while (uVar9 < uVar7);
  }
LAB_00108605:
  boost::container::throw_out_of_range("vector::at out of range");
}

Assistant:

std::size_t choose_leaf(const indexable_type& entry)
    {
        if(this->root_ == nil)
        {
            node_type n(true, nil);
            n.box = make_aabb(entry);
            this->root_ = this->add_node(n);

            return this->root_;
        }

        // choose a leaf to insert
        // so if root is a leaf, return it
        std::size_t node_idx = this->root_;
        while(!(this->tree_.at(node_idx).is_leaf))
        {
            // find minimum expansion
            scalar_type diff_area_min = std::numeric_limits<scalar_type>::max();
            scalar_type area_min      = std::numeric_limits<scalar_type>::max();

            const node_type& node = this->tree_.at(node_idx);
            for(typename node_type::const_iterator
                    i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const scalar_type area_initial
                    = area(this->tree_.at(*i).box, this->boundary_);

                const scalar_type area_expanded
                    = area(expand(this->tree_.at(*i).box, entry, this->boundary_),
                           this->boundary_);

                const scalar_type diff_area = area_expanded - area_initial;
                if((diff_area <  diff_area_min) ||
                   (diff_area == diff_area_min  && area_expanded < area_min))
                {
                    node_idx = *i;
                    diff_area_min = diff_area;
                    area_min      = std::min(area_min, area_expanded);
                }
            }
        }
        return node_idx;
    }